

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evol.c
# Opt level: O0

FMStructDescList build_struct_list(FMFormat_conflict format)

{
  long lVar1;
  FMStructDescList p_Var2;
  long in_RDI;
  FMFormat_conflict subformat;
  int count;
  FMStructDescList ret;
  size_t in_stack_ffffffffffffffe0;
  int local_14;
  
  local_14 = 0;
  while (*(long *)(*(long *)(in_RDI + 0x70) + (long)local_14 * 8) != 0) {
    local_14 = local_14 + 1;
  }
  p_Var2 = (FMStructDescList)ffs_malloc(in_stack_ffffffffffffffe0);
  p_Var2->format_name = *(char **)(in_RDI + 0x10);
  p_Var2->field_list = *(FMFieldList *)(in_RDI + 0x78);
  p_Var2->struct_size = *(int *)(in_RDI + 0x30);
  p_Var2->opt_info = (FMOptInfo *)0x0;
  local_14 = 0;
  while (*(long *)(*(long *)(in_RDI + 0x70) + (long)local_14 * 8) != 0) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x70) + (long)local_14 * 8);
    p_Var2[local_14 + 1].format_name = *(char **)(lVar1 + 0x10);
    p_Var2[local_14 + 1].field_list = *(FMFieldList *)(lVar1 + 0x78);
    p_Var2[local_14 + 1].struct_size = *(int *)(lVar1 + 0x30);
    p_Var2[local_14 + 1].opt_info = (FMOptInfo *)0x0;
    local_14 = local_14 + 1;
  }
  p_Var2[local_14 + 1].format_name = (char *)0x0;
  p_Var2[local_14 + 1].field_list = (FMFieldList)0x0;
  p_Var2[local_14 + 1].struct_size = 0;
  p_Var2[local_14 + 1].opt_info = (FMOptInfo *)0x0;
  return p_Var2;
}

Assistant:

static FMStructDescList
build_struct_list(FMFormat format)
{
    FMStructDescList ret;
    int count = 0;
    while (format->subformats[count] != NULL) count++;
    count+=2;
    ret = malloc(count * sizeof(ret[0]));
    ret[0].format_name = format->format_name;
    ret[0].field_list = format->field_list;
    ret[0].struct_size = format->record_length;
    ret[0].opt_info = NULL;
    count = 0;
    while(format->subformats[count] != NULL) {
	FMFormat subformat = format->subformats[count];
	ret[count+1].format_name = subformat->format_name;
	ret[count+1].field_list = subformat->field_list;
	ret[count+1].struct_size = subformat->record_length;
	ret[count+1].opt_info = NULL;
	count++;
    }
    ret[count+1].format_name = NULL;
    ret[count+1].field_list = NULL;
    ret[count+1].struct_size = 0;
    ret[count+1].opt_info = NULL;
    return ret;
}